

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O1

void compareDwa(int width,int height,Array2D<Imf_3_2::Rgba> *src,Array2D<Imf_3_2::Rgba> *test,
               RgbaChannels channels)

{
  float *pfVar1;
  float fVar2;
  half hVar3;
  ulong uVar4;
  Rgba *pRVar5;
  half *phVar6;
  ulong uVar7;
  half *phVar8;
  ulong uVar9;
  ulong uVar10;
  half unaff_R13W;
  int iVar11;
  float fVar12;
  
  uVar4 = (ulong)(uint)width;
  if (0 < height) {
    uVar7 = 0;
    uVar9 = uVar4;
    do {
      if (0 < width) {
        uVar10 = 0;
        do {
          iVar11 = 0;
          do {
            if (iVar11 == 2) {
              if ((channels & WRITE_B) != 0) {
                unaff_R13W = toNonlinear(src->_data[src->_sizeY * uVar7 + uVar10].b._h);
                pRVar5 = (Rgba *)&test->_data[test->_sizeY * uVar7 + uVar10].b;
LAB_00121017:
                hVar3 = toNonlinear((pRVar5->r)._h);
                uVar9 = (ulong)hVar3._h;
LAB_0012102e:
                fVar2 = *(float *)(_imath_half_to_float_table + (ulong)unaff_R13W._h * 4);
                fVar12 = *(float *)(_imath_half_to_float_table + (uVar9 & 0xffff) * 4);
                if (unaff_R13W._h == 0) {
                  if ((fVar2 == fVar12) && (!NAN(fVar2) && !NAN(fVar12))) {
                    __assert_fail("srcNonlin != testNonlin",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                  ,0x66,
                                  "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                                 );
                  }
                }
                else if (0.1 <= ABS(fVar2)) {
                  fVar12 = ABS((fVar2 - fVar12) / fVar2);
                  if (0.25 <= ABS(fVar2)) {
                    if (0.1 <= fVar12) {
                      __assert_fail("relError < .1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                    ,0x61,
                                    "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                                   );
                    }
                  }
                  else if (0.25 <= fVar12) {
                    __assert_fail("relError < .25",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                                  ,0x5e,
                                  "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                                 );
                  }
                }
              }
            }
            else if (iVar11 == 1) {
              if ((channels & WRITE_G) != 0) {
                unaff_R13W = toNonlinear(src->_data[src->_sizeY * uVar7 + uVar10].g._h);
                pRVar5 = (Rgba *)&test->_data[test->_sizeY * uVar7 + uVar10].g;
                goto LAB_00121017;
              }
            }
            else {
              if (iVar11 != 0) goto LAB_0012102e;
              if ((channels & WRITE_R) != 0) {
                unaff_R13W = toNonlinear(src->_data[src->_sizeY * uVar7 + uVar10].r._h);
                pRVar5 = test->_data + test->_sizeY * uVar7 + uVar10;
                goto LAB_00121017;
              }
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 != 3);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)height);
  }
  if (0 < height && (channels & WRITE_A) != 0) {
    phVar6 = &src->_data->a;
    phVar8 = &test->_data->a;
    uVar9 = 0;
    do {
      if (0 < width) {
        uVar7 = 0;
        do {
          fVar2 = *(float *)(_imath_half_to_float_table + (ulong)phVar6[uVar7 * 4]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar8[uVar7 * 4]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("src[y][x].a == test[y][x].a",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareDwa.cpp"
                          ,0x75,
                          "void compareDwa(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                         );
          }
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      uVar9 = uVar9 + 1;
      phVar6 = phVar6 + src->_sizeY * 4;
      phVar8 = phVar8 + test->_sizeY * 4;
    } while (uVar9 != (uint)height);
  }
  return;
}

Assistant:

void
compareDwa (
    int                  width,
    int                  height,
    const Array2D<Rgba>& src,
    const Array2D<Rgba>& test,
    RgbaChannels         channels)
{
    half  srcNonlin, testNonlin;
    float relError;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {

            for (int comp = 0; comp < 3; ++comp)
            {
                switch (comp)
                {
                    case 0:
                        if (!(channels & WRITE_R)) continue;

                        srcNonlin  = toNonlinear (src[y][x].r);
                        testNonlin = toNonlinear (test[y][x].r);
                        break;
                    case 1:
                        if (!(channels & WRITE_G)) continue;

                        srcNonlin  = toNonlinear (src[y][x].g);
                        testNonlin = toNonlinear (test[y][x].g);
                        break;
                    case 2:
                        if (!(channels & WRITE_B)) continue;

                        srcNonlin  = toNonlinear (src[y][x].b);
                        testNonlin = toNonlinear (test[y][x].b);
                        break;
                }

                //
                // Try to compare with relative error. This breaks down
                // for small numbers, which could be quantiezed to 0
                // giving 100% error.
                //
                if (srcNonlin.bits () != 0x00)
                {

                    relError = fabs ((float) srcNonlin - (float) testNonlin) /
                               fabs ((float) srcNonlin);

                    if (fabs (srcNonlin) < .1) continue;

                    if (fabs (srcNonlin) < .25) { assert (relError < .25); }
                    else
                    {
                        assert (relError < .1);
                    }
                }
                else
                {
                    assert (srcNonlin != testNonlin);
                }
            }
        }
    }

    //
    // Test alpha, if necessary
    //
    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                assert (src[y][x].a == test[y][x].a);
            }
        }
    }
}